

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::GetProperty_Internal<false>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          Var originalInstance,PropertyId propertyId,Var *value,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  code *pcVar1;
  Var originalInstance_00;
  Var instance_00;
  bool bVar2;
  uint32 index;
  undefined4 *puVar3;
  ScriptContext *this_00;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  RecyclableObject *pRVar4;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyValueInfo *info_local;
  Var *value_local;
  Var pvStack_28;
  PropertyId propertyId_local;
  Var originalInstance_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)info;
  info_local = (PropertyValueInfo *)value;
  value_local._4_4_ = propertyId;
  pvStack_28 = originalInstance;
  originalInstance_local = instance;
  instance_local = (DynamicObject *)this;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x233,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)originalInstance_local);
  local_50 = ScriptContext::GetPropertyName(this_00,value_local._4_4_);
  this_01 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_01,&local_50,
                     (DictionaryPropertyDescriptor<unsigned_short> **)&propertyRecord);
  if (bVar2) {
    this_local._4_4_ =
         GetPropertyFromDescriptor<false,int>
                   (this,(DynamicObject *)originalInstance_local,pvStack_28,
                    (DictionaryPropertyDescriptor<unsigned_short> *)propertyRecord,
                    &info_local->m_instance,(PropertyValueInfo *)descriptor,value_local._4_4_,
                    requestContext);
  }
  else {
    bVar2 = DynamicObject::HasObjectArray((DynamicObject *)originalInstance_local);
    if ((bVar2) &&
       (bVar2 = PropertyRecord::IsNumeric(local_50), instance_00 = originalInstance_local,
       originalInstance_00 = pvStack_28, bVar2)) {
      index = PropertyRecord::GetNumericValue(local_50);
      this_local._4_4_ =
           DynamicTypeHandler::GetItem
                     (&this->super_DynamicTypeHandler,(DynamicObject *)instance_00,
                      originalInstance_00,index,&info_local->m_instance,requestContext);
    }
    else {
      pRVar4 = ScriptContext::GetMissingPropertyResult(requestContext);
      info_local->m_instance = pRVar4;
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::GetProperty_Internal(DynamicObject* instance, Var originalInstance, PropertyId propertyId,
        Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            return GetPropertyFromDescriptor<allowLetConstGlobal>(instance, originalInstance, descriptor, value, info, propertyId, requestContext);
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return DictionaryTypeHandlerBase<T>::GetItem(instance, originalInstance, propertyRecord->GetNumericValue(), value, requestContext);
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }